

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract.c
# Opt level: O1

ErrorNumber test_abstract(void)

{
  bool bVar1;
  TA_ParamHolder *param;
  ErrorNumber EVar2;
  TA_RetCode TVar3;
  char *pcVar4;
  undefined8 uVar5;
  long lVar6;
  TA_ParamHolder *paramHolder;
  TA_FuncHandle *handle;
  int local_2c;
  TA_ParamHolder *local_28;
  TA_FuncHandle *local_20;
  
  puts("Testing Abstract interface");
  EVar2 = allocLib();
  if (EVar2 != TA_TEST_PASS) {
    return EVar2;
  }
  TVar3 = TA_GetFuncHandle("STOCH",&local_20);
  if (TVar3 != TA_SUCCESS) {
    printf("Can\'t get the function handle [%d]\n",(ulong)TVar3);
    return TA_ABS_TST_FAIL_GETFUNCHANDLE;
  }
  TVar3 = TA_ParamHolderAlloc(local_20,&local_28);
  param = local_28;
  if (TVar3 != TA_SUCCESS) {
    printf("Can\'t allocate the param holder [%d]\n",(ulong)TVar3);
    return TA_ABS_TST_FAIL_PARAMHOLDERALLOC;
  }
  TVar3 = TA_SetOptInputParamInteger(local_28,0,3);
  if ((((TVar3 == TA_SUCCESS) &&
       (TVar3 = TA_SetOptInputParamInteger(param,1,4), TVar3 == TA_SUCCESS)) &&
      (TVar3 = TA_SetOptInputParamInteger(param,2,0), TVar3 == TA_SUCCESS)) &&
     ((TVar3 = TA_SetOptInputParamInteger(param,3,4), TVar3 == TA_SUCCESS &&
      (TVar3 = TA_SetOptInputParamInteger(param,4,0), TVar3 == TA_SUCCESS)))) {
    TVar3 = TA_GetLookback(param,&local_2c);
    if (TVar3 != TA_SUCCESS) {
      bVar1 = false;
      printf("TA_GetLookback failed [%d]\n",(ulong)TVar3);
      uVar5 = 0x260;
      goto LAB_0011dded;
    }
    if (local_2c != 8) {
      bVar1 = false;
      printf("TA_GetLookback failed [%d != 8]\n");
      uVar5 = 0x262;
      goto LAB_0011dded;
    }
    TVar3 = TA_SetOptInputParamInteger(param,3,3);
    if (TVar3 == TA_SUCCESS) {
      TVar3 = TA_GetLookback(param,&local_2c);
      if (TVar3 == TA_SUCCESS) {
        if (local_2c == 7) {
          uVar5 = 0;
          bVar1 = true;
        }
        else {
          bVar1 = false;
          printf("TA_GetLookback failed [%d != 7]\n");
          uVar5 = 0x263;
        }
      }
      else {
        bVar1 = false;
        printf("TA_GetLookback failed [%d]\n",(ulong)TVar3);
        uVar5 = 0x261;
      }
      goto LAB_0011dded;
    }
  }
  bVar1 = false;
  printf("TA_SetOptInputParamInteger call failed [%d]\n",(ulong)TVar3);
  uVar5 = 0x25d;
LAB_0011dded:
  EVar2 = (ErrorNumber)uVar5;
  if (bVar1) {
    TVar3 = TA_ParamHolderFree(local_28);
    if (TVar3 == TA_SUCCESS) {
      EVar2 = freeLib();
      if ((EVar2 == TA_TEST_PASS) && (EVar2 = allocLib(), EVar2 == TA_TEST_PASS)) {
        EVar2 = test_default_calls();
        if (EVar2 == TA_TEST_PASS) {
          EVar2 = freeLib();
          if (EVar2 == TA_TEST_PASS) {
            lVar6 = 0;
            pcVar4 = TA_FunctionDescriptionXML();
            do {
              if (pcVar4[lVar6] == '\0') goto LAB_0011de9d;
              lVar6 = lVar6 + 1;
            } while (lVar6 != 1000000);
            lVar6 = 1000000;
LAB_0011de9d:
            if ((uint)lVar6 < 500) {
              puts("TA_FunctionDescriptionXML failed. Size too small.");
              EVar2 = TA_ABS_TST_FAIL_FUNCTION_DESC_SMALL;
            }
            else {
              EVar2 = TA_TEST_PASS;
              if ((uint)lVar6 == 1000000) {
                puts("TA_FunctionDescriptionXML failed. Size too large (missing null?).");
                EVar2 = TA_ABS_TST_FAIL_FUNCTION_DESC_LARGE;
              }
            }
          }
        }
        else {
          puts("TA-Abstract default call failed");
        }
      }
    }
    else {
      printf("TA_ParamHolderFree failed [%d]\n",(ulong)TVar3);
      EVar2 = TA_ABS_TST_FAIL_PARAMHOLDERFREE;
    }
  }
  else {
    printf("testLookback() failed [%d]\n",uVar5);
    TA_ParamHolderFree(local_28);
  }
  return EVar2;
}

Assistant:

ErrorNumber test_abstract( void )
{
   ErrorNumber retValue;
   TA_RetCode retCode;
   TA_ParamHolder *paramHolder;
   const TA_FuncHandle *handle;
   int i;
   const char *xmlArray;

   printf( "Testing Abstract interface\n" );

   retValue = allocLib();
   if( retValue != TA_TEST_PASS )
      return retValue;

   /* Verify TA_GetLookback. */
   retCode = TA_GetFuncHandle( "STOCH", &handle );
   if( retCode != TA_SUCCESS )
   {
      printf( "Can't get the function handle [%d]\n", retCode );
      return TA_ABS_TST_FAIL_GETFUNCHANDLE;
   }

   retCode = TA_ParamHolderAlloc( handle, &paramHolder );
   if( retCode != TA_SUCCESS )
   {
      printf( "Can't allocate the param holder [%d]\n", retCode );
      return TA_ABS_TST_FAIL_PARAMHOLDERALLOC;
   }

   retValue = testLookback(paramHolder);
   if( retValue != TA_SUCCESS )
   {
      printf( "testLookback() failed [%d]\n", retValue );
      TA_ParamHolderFree( paramHolder );
      return retValue;
   }

   retCode = TA_ParamHolderFree( paramHolder );
   if( retCode != TA_SUCCESS )
   {
      printf( "TA_ParamHolderFree failed [%d]\n", retCode );
      return TA_ABS_TST_FAIL_PARAMHOLDERFREE;
   }

   retValue = freeLib();
   if( retValue != TA_TEST_PASS )
      return retValue;

   /* Call all the TA functions through the abstract interface. */
   retValue = allocLib();
   if( retValue != TA_TEST_PASS )
      return retValue;

   retValue = test_default_calls();
   if( retValue != TA_TEST_PASS )
   {
      printf( "TA-Abstract default call failed\n" );
      return retValue;
   }

   retValue = freeLib();
   if( retValue != TA_TEST_PASS )
      return retValue;

   /* Verify that the TA_FunctionDescription is null terminated
    * and as at least 500 characters (less is guaranteed bad...)
    */
   xmlArray = TA_FunctionDescriptionXML();
   for( i=0; i < 1000000; i++ )
   {
      if( xmlArray[i] == 0x0 )
         break;
   }

   if( i < 500)
   {
      printf( "TA_FunctionDescriptionXML failed. Size too small.\n" );
      return TA_ABS_TST_FAIL_FUNCTION_DESC_SMALL;
   }

   if( i == 1000000 )
   {
      printf( "TA_FunctionDescriptionXML failed. Size too large (missing null?).\n" );
      return TA_ABS_TST_FAIL_FUNCTION_DESC_LARGE;
   }

   return TA_TEST_PASS; /* Succcess. */
}